

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O0

void ay8910_write(void *chip,UINT8 addr,UINT8 data)

{
  ay8910_context *psg;
  UINT8 data_local;
  UINT8 addr_local;
  void *chip_local;
  
  if ((addr & 1) == 0) {
    *(bool *)((long)chip + 0x26) = (int)(uint)data >> 4 == 0;
    if (*(char *)((long)chip + 0x26) == '\0') {
      emu_logf((DEV_LOGGER *)((long)chip + 8),'\x02',"upper address mismatch\n");
    }
    else {
      *(byte *)((long)chip + 0x27) = data & 0xf;
    }
  }
  else if (*(char *)((long)chip + 0x26) != '\0') {
    ay8910_write_reg((ay8910_context *)chip,*(UINT8 *)((long)chip + 0x27),data);
  }
  return;
}

Assistant:

void ay8910_write(void *chip, UINT8 addr, UINT8 data)
{
	ay8910_context *psg = (ay8910_context *)chip;

	if (addr & 1)
	{
		if (psg->active)
		{
			/* Data port */
			ay8910_write_reg(psg, psg->register_latch, data);
		}
	}
	else
	{
		psg->active = (data >> 4) == 0; // mask programmed 4-bit code
		if (psg->active)
		{
			/* Register port */
			psg->register_latch = data & 0x0f;
		}
		else
		{
			emu_logf(&psg->logger, DEVLOG_WARN, "upper address mismatch\n");
		}
	}
}